

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4161a3::SpecialName::printLeft(SpecialName *this,OutputStream *S)

{
  OutputStream *S_local;
  SpecialName *this_local;
  
  OutputStream::operator+=(S,this->Special);
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Special;
    Child->print(S);
  }